

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void nlohmann::adl_serializer<Eigen::Matrix<double,1,3,1,1,3>,void>::
     to_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *json,Vector<3> *point)

{
  Vector<3> *this;
  long lVar1;
  Index IVar2;
  CoeffReturnType val;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  int local_1c;
  EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *pEStack_18;
  int i;
  Vector<3> *point_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *json_local;
  
  local_1c = 0;
  pEStack_18 = (EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)point;
  point_local = (Vector<3> *)json;
  while( true ) {
    lVar1 = (long)local_1c;
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::size(pEStack_18);
    this = point_local;
    if (IVar2 <= lVar1) break;
    val = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)pEStack_18,
                     (long)local_1c);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_double_&,_double,_0>(&local_30,val);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this,&local_30);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_30);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void
        to_json(TJson& json, const anurbs::linear_algebra::Vector<3>& point)
        {
            for (int i = 0; i < point.size(); i++) {
                json.push_back(point[i]);
            }
        }